

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::Reader::readObject(Reader *this,Token *tokenStart)

{
  iterator *piVar1;
  ushort uVar2;
  ValueHolder *pVVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  Value *pVVar7;
  long *plVar8;
  _Elt_pointer ppVVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  undefined8 uVar11;
  ValueHolder VVar12;
  byte unaff_R12B;
  ushort uVar13;
  string name;
  Token comma;
  Token colon;
  Token tokenName;
  ValueHolder local_c0;
  long local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  Token local_60;
  Token local_48;
  
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  uVar13 = (ushort)local_b8 & 0xfe00;
  local_b8._0_2_ = uVar13 + 7;
  pcVar6 = (char *)operator_new(0x30);
  pcVar6[0x10] = '\0';
  pcVar6[0x11] = '\0';
  pcVar6[0x12] = '\0';
  pcVar6[0x13] = '\0';
  pcVar6[0x14] = '\0';
  pcVar6[0x15] = '\0';
  pcVar6[0x16] = '\0';
  pcVar6[0x17] = '\0';
  pcVar6[0x18] = '\0';
  pcVar6[0x19] = '\0';
  pcVar6[0x1a] = '\0';
  pcVar6[0x1b] = '\0';
  pcVar6[0x1c] = '\0';
  pcVar6[0x1d] = '\0';
  pcVar6[0x1e] = '\0';
  pcVar6[0x1f] = '\0';
  pcVar6[0x20] = '\0';
  pcVar6[0x21] = '\0';
  pcVar6[0x22] = '\0';
  pcVar6[0x23] = '\0';
  pcVar6[0x24] = '\0';
  pcVar6[0x25] = '\0';
  pcVar6[0x26] = '\0';
  pcVar6[0x27] = '\0';
  pcVar6[0x28] = '\0';
  pcVar6[0x29] = '\0';
  pcVar6[0x2a] = '\0';
  pcVar6[0x2b] = '\0';
  pcVar6[0x2c] = '\0';
  pcVar6[0x2d] = '\0';
  pcVar6[0x2e] = '\0';
  pcVar6[0x2f] = '\0';
  pcVar6[0] = '\0';
  pcVar6[1] = '\0';
  pcVar6[2] = '\0';
  pcVar6[3] = '\0';
  pcVar6[4] = '\0';
  pcVar6[5] = '\0';
  pcVar6[6] = '\0';
  pcVar6[7] = '\0';
  pcVar6[8] = '\0';
  pcVar6[9] = '\0';
  pcVar6[10] = '\0';
  pcVar6[0xb] = '\0';
  pcVar6[0xc] = '\0';
  pcVar6[0xd] = '\0';
  pcVar6[0xe] = '\0';
  pcVar6[0xf] = '\0';
  *(char **)(pcVar6 + 0x18) = pcVar6 + 8;
  *(char **)(pcVar6 + 0x20) = pcVar6 + 8;
  pcVar6[0x28] = '\0';
  pcVar6[0x29] = '\0';
  pcVar6[0x2a] = '\0';
  pcVar6[0x2b] = '\0';
  pcVar6[0x2c] = '\0';
  pcVar6[0x2d] = '\0';
  pcVar6[0x2e] = '\0';
  pcVar6[0x2f] = '\0';
  ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar9 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pVVar7 = ppVVar9[-1];
  local_c0.map_ = *(ObjectValues **)&pVVar7->value_;
  (pVVar7->value_).string_ = pcVar6;
  uVar2 = *(ushort *)&pVVar7->field_0x8;
  *(ushort *)&pVVar7->field_0x8 = uVar2 & 0xff00 | 7;
  *(ushort *)&pVVar7->field_0x8 = uVar2 & 0xfe00 | 7;
  local_b8 = CONCAT62(local_b8._2_6_,uVar2 & 0x100 | uVar13 | uVar2 & 0xff);
  Value::~Value((Value *)&local_c0);
  do {
    readToken(this,&local_48);
    while (local_48.type_ == tokenComment) {
      readToken(this,&local_48);
    }
    if (local_48.type_ == tokenObjectEnd) {
      if ((char *)local_a0._M_string_length == (char *)0x0) {
LAB_001c63bb:
        unaff_R12B = 1;
        iVar5 = 1;
      }
      else {
        iVar5 = 3;
      }
    }
    else if (local_48.type_ == tokenString) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_a0,0,(char *)local_a0._M_string_length,0x279509);
      bVar4 = decodeString(this,&local_48,&local_a0);
      if (!bVar4) {
        recoverFromError(this,tokenObjectEnd);
        goto LAB_001c6431;
      }
      readToken(this,&local_60);
      if (local_60.type_ == tokenMemberSeparator) {
        ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (ppVVar9 ==
            (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVVar9 = (this->nodes_).c.
                    super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        if ((ppVVar9[-1]->field_0x8 == '\a') &&
           (pVVar7 = Value::operator[](ppVVar9[-1],local_a0._M_dataplus._M_p),
           pVVar7 != (Value *)Value::null)) {
          std::operator+(&local_80,"Key \'",&local_a0);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_80);
          local_c0.string_ = (char *)&local_b0;
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 == paVar10) {
            local_b0._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_b0._8_8_ = plVar8[3];
          }
          else {
            local_b0._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_c0.string_ = (char *)*plVar8;
          }
          local_b8 = plVar8[1];
          *plVar8 = (long)paVar10;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          addError(this,(string *)&local_c0,&local_48,(Location)0x0);
          if (local_c0 != &local_b0) {
            operator_delete(local_c0.string_,local_b0._M_allocated_capacity + 1);
          }
          VVar12._4_4_ = local_80._M_dataplus._M_p._4_4_;
          VVar12.int_ = (uint)local_80._M_dataplus._M_p;
          uVar11 = local_80.field_2._M_allocated_capacity;
          if (VVar12 != &local_80.field_2) goto LAB_001c6429;
        }
        else {
          ppVVar9 = (this->nodes_).c.
                    super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur;
          if (ppVVar9 ==
              (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVVar9 = (this->nodes_).c.
                      super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          local_c0.map_ =
               (ObjectValues *)Value::resolveReference(ppVVar9[-1],local_a0._M_dataplus._M_p,false);
          pVVar3 = (ValueHolder *)
                   (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (pVVar3 == (ValueHolder *)
                        ((this->nodes_).c.
                         super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_last + -1)) {
            std::deque<Json::Value*,std::allocator<Json::Value*>>::_M_push_back_aux<Json::Value*>
                      ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,
                       (Value **)&local_c0.map_);
          }
          else {
            pVVar3->map_ = (ObjectValues *)local_c0;
            piVar1 = &(this->nodes_).c.
                      super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                      super__Deque_impl_data._M_finish;
            piVar1->_M_cur = piVar1->_M_cur + 1;
          }
          bVar4 = readValue(this);
          std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
                    ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
          if (bVar4) {
            readToken(this,(Token *)&local_80);
            if (((uint)local_80._M_dataplus._M_p < 0xe) &&
               ((0x2804U >> ((uint)local_80._M_dataplus._M_p & 0x1f) & 1) != 0)) {
              while ((uint)local_80._M_dataplus._M_p == 0xd) {
                readToken(this,(Token *)&local_80);
              }
              if ((uint)local_80._M_dataplus._M_p == 2) goto LAB_001c63bb;
              iVar5 = 0;
              goto LAB_001c6439;
            }
            local_c0.string_ = (char *)&local_b0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c0,"Missing \',\' or \'}\' in object declaration","");
            addError(this,(string *)&local_c0,(Token *)&local_80,(Location)0x0);
            recoverFromError(this,tokenObjectEnd);
            goto LAB_001c62df;
          }
          recoverFromError(this,tokenObjectEnd);
        }
      }
      else {
        local_c0.string_ = (char *)&local_b0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c0,"Missing \':\' after object member name","");
        addError(this,(string *)&local_c0,&local_60,(Location)0x0);
        recoverFromError(this,tokenObjectEnd);
LAB_001c62df:
        uVar11 = local_b0._M_allocated_capacity;
        VVar12 = local_c0;
        if (local_c0 != &local_b0) {
LAB_001c6429:
          operator_delete(VVar12.string_,uVar11 + 1);
        }
      }
LAB_001c6431:
      iVar5 = 1;
      unaff_R12B = 0;
    }
    else {
      iVar5 = 3;
    }
LAB_001c6439:
    if (iVar5 != 0) {
      if (iVar5 == 3) {
        local_c0.string_ = (char *)&local_b0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c0,"Missing \'}\' or object member name","");
        addError(this,(string *)&local_c0,&local_48,(Location)0x0);
        recoverFromError(this,tokenObjectEnd);
        if (local_c0 != &local_b0) {
          operator_delete(local_c0.string_,local_b0._M_allocated_capacity + 1);
        }
        unaff_R12B = 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,
                        CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                 local_a0.field_2._M_local_buf[0]) + 1);
      }
      return (bool)(unaff_R12B & 1);
    }
  } while( true );
}

Assistant:

bool
Reader::readObject ( Token& tokenStart )
{
    Token tokenName;
    std::string name;
    currentValue () = Value ( objectValue );

    while ( readToken ( tokenName ) )
    {
        bool initialTokenOk = true;

        while ( tokenName.type_ == tokenComment  &&  initialTokenOk )
            initialTokenOk = readToken ( tokenName );

        if  ( !initialTokenOk )
            break;

        if ( tokenName.type_ == tokenObjectEnd  &&  name.empty () ) // empty object
            return true;

        if ( tokenName.type_ != tokenString )
            break;

        name = "";

        if ( !decodeString ( tokenName, name ) )
            return recoverFromError ( tokenObjectEnd );

        Token colon;

        if ( !readToken ( colon ) ||  colon.type_ != tokenMemberSeparator )
        {
            return addErrorAndRecover ( "Missing ':' after object member name",
                                        colon,
                                        tokenObjectEnd );
        }

        // Reject duplicate names
        if (currentValue ().isMember (name))
            return addError ( "Key '" + name + "' appears twice.", tokenName );

        Value& value = currentValue ()[ name ];
        nodes_.push ( &value );
        bool ok = readValue ();
        nodes_.pop ();

        if ( !ok ) // error already set
            return recoverFromError ( tokenObjectEnd );

        Token comma;

        if ( !readToken ( comma )
                ||  ( comma.type_ != tokenObjectEnd  &&
                      comma.type_ != tokenArraySeparator &&
                      comma.type_ != tokenComment ) )
        {
            return addErrorAndRecover ( "Missing ',' or '}' in object declaration",
                                        comma,
                                        tokenObjectEnd );
        }

        bool finalizeTokenOk = true;

        while ( comma.type_ == tokenComment &&
                finalizeTokenOk )
            finalizeTokenOk = readToken ( comma );

        if ( comma.type_ == tokenObjectEnd )
            return true;
    }

    return addErrorAndRecover ( "Missing '}' or object member name",
                                tokenName,
                                tokenObjectEnd );
}